

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

void __thiscall QSQLiteResultPrivate::cleanup(QSQLiteResultPrivate *this,EVP_PKEY_CTX *ctx)

{
  QSQLiteResultPrivate *this_00;
  QSQLiteResult *q;
  
  this_00 = (QSQLiteResultPrivate *)q_func(this);
  finalize(this_00);
  QSqlRecord::clear();
  this->skippedStatus = false;
  this->skipRow = false;
  (**(code **)(*(long *)&this_00->super_QSqlCachedResultPrivate + 0x18))(this_00,0xffffffff);
  (**(code **)(*(long *)&this_00->super_QSqlCachedResultPrivate + 0x20))(this_00,0);
  QSqlCachedResult::cleanup();
  return;
}

Assistant:

void QSQLiteResultPrivate::cleanup()
{
    Q_Q(QSQLiteResult);
    finalize();
    rInf.clear();
    skippedStatus = false;
    skipRow = false;
    q->setAt(QSql::BeforeFirstRow);
    q->setActive(false);
    q->cleanup();
}